

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::InitSRBResourceCache
          (PipelineResourceSignatureVkImpl *this,ShaderResourceCacheVk *ResourceCache)

{
  Uint32 ArraySize;
  undefined8 uVar1;
  char *pcVar2;
  undefined4 NumSets_00;
  ResourceCacheContentType CacheType_00;
  DescriptorType Type;
  bool HasImmutableSampler;
  Uint32 UVar3;
  Uint32 Offset;
  reference pvVar4;
  Char *Message;
  IMemoryAllocator *MemAllocator;
  pointer SetSizes;
  PipelineResourceDesc *pPVar5;
  PipelineResourceAttribsType *this_00;
  VkDescriptorSetLayout SetLayout;
  RenderDeviceVkImpl *this_01;
  char (*in_RCX) [31];
  undefined1 local_d0 [8];
  DescriptorSetAllocation SetAllocation;
  string local_a8 [8];
  string _DescrSetName;
  char *DescrSetName;
  VkDescriptorSetLayout vkLayout;
  PipelineResourceAttribsType *Attr;
  PipelineResourceDesc *ResDesc;
  Uint32 r;
  ResourceCacheContentType CacheType;
  Uint32 TotalResources;
  IMemoryAllocator *CacheMemAllocator;
  undefined1 local_40 [8];
  string msg;
  Uint32 i;
  Uint32 NumSets;
  ShaderResourceCacheVk *ResourceCache_local;
  PipelineResourceSignatureVkImpl *this_local;
  
  msg.field_2._12_4_ = GetNumDescriptorSets(this);
  for (msg.field_2._8_4_ = 0; (uint)msg.field_2._8_4_ < (uint)msg.field_2._12_4_;
      msg.field_2._8_4_ = msg.field_2._8_4_ + 1) {
    pvVar4 = std::array<unsigned_int,_2UL>::operator[]
                       (&this->m_DescriptorSetSizes,(ulong)(uint)msg.field_2._8_4_);
    if (*pvVar4 == 0xffffffff) {
      FormatString<char[26],char[31]>
                ((string *)local_40,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_DescriptorSetSizes[i] != ~0U",in_RCX);
      Message = (Char *)std::__cxx11::string::c_str();
      in_RCX = (char (*) [31])0x1f2;
      DebugAssertionFailed
                (Message,"InitSRBResourceCache",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                 ,0x1f2);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  MemAllocator = SRBMemoryAllocator::GetResourceCacheDataAllocator
                           (&(this->
                             super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                             m_SRBMemAllocator,0);
  NumSets_00 = msg.field_2._12_4_;
  SetSizes = std::array<unsigned_int,_2UL>::data(&this->m_DescriptorSetSizes);
  ShaderResourceCacheVk::InitializeSets(ResourceCache,MemAllocator,NumSets_00,SetSizes);
  UVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                    (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
  CacheType_00 = ShaderResourceCacheVk::GetContentType(ResourceCache);
  for (ResDesc._4_4_ = 0; ResDesc._4_4_ < UVar3; ResDesc._4_4_ = ResDesc._4_4_ + 1) {
    pPVar5 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                       (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                        ResDesc._4_4_);
    this_00 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                        (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                         ResDesc._4_4_);
    uVar1 = *(undefined8 *)this_00;
    Offset = PipelineResourceAttribsVk::CacheOffset(this_00,CacheType_00);
    ArraySize = pPVar5->ArraySize;
    Type = PipelineResourceAttribsVk::GetDescriptorType(this_00);
    HasImmutableSampler = PipelineResourceAttribsVk::IsImmutableSamplerAssigned(this_00);
    ShaderResourceCacheVk::InitializeResources
              (ResourceCache,(uint)((ulong)uVar1 >> 0x3e) & 1,Offset,ArraySize,Type,
               HasImmutableSampler);
  }
  ShaderResourceCacheVk::DbgVerifyResourceInitialization(ResourceCache);
  SetLayout = GetVkDescriptorSetLayout(this,DESCRIPTOR_SET_ID_STATIC_MUTABLE);
  if (SetLayout != (VkDescriptorSetLayout)0x0) {
    _DescrSetName.field_2._8_8_ = anon_var_dwarf_220777;
    pcVar2 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
             .m_Desc.super_DeviceObjectAttribs.Name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,pcVar2,(allocator *)((long)&SetAllocation.DescrSetAllocator + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&SetAllocation.DescrSetAllocator + 7));
    std::__cxx11::string::append((char *)local_a8);
    _DescrSetName.field_2._8_8_ = std::__cxx11::string::c_str();
    this_01 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                           *)this);
    RenderDeviceVkImpl::AllocateDescriptorSet
              ((DescriptorSetAllocation *)local_d0,this_01,0xffffffffffffffff,SetLayout,
               (char *)_DescrSetName.field_2._8_8_);
    UVar3 = GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>
                      (this);
    ShaderResourceCacheVk::AssignDescriptorSetAllocation
              (ResourceCache,UVar3,(DescriptorSetAllocation *)local_d0);
    DescriptorSetAllocation::~DescriptorSetAllocation((DescriptorSetAllocation *)local_d0);
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void PipelineResourceSignatureVkImpl::InitSRBResourceCache(ShaderResourceCacheVk& ResourceCache)
{
    const auto NumSets = GetNumDescriptorSets();
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < NumSets; ++i)
        VERIFY_EXPR(m_DescriptorSetSizes[i] != ~0U);
#endif

    auto& CacheMemAllocator = m_SRBMemAllocator.GetResourceCacheDataAllocator(0);
    ResourceCache.InitializeSets(CacheMemAllocator, NumSets, m_DescriptorSetSizes.data());

    const auto TotalResources = GetTotalResourceCount();
    const auto CacheType      = ResourceCache.GetContentType();
    for (Uint32 r = 0; r < TotalResources; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& Attr    = GetResourceAttribs(r);
        ResourceCache.InitializeResources(Attr.DescrSet, Attr.CacheOffset(CacheType), ResDesc.ArraySize,
                                          Attr.GetDescriptorType(), Attr.IsImmutableSamplerAssigned());
    }

#ifdef DILIGENT_DEBUG
    ResourceCache.DbgVerifyResourceInitialization();
#endif

    if (auto vkLayout = GetVkDescriptorSetLayout(DESCRIPTOR_SET_ID_STATIC_MUTABLE))
    {
        const char* DescrSetName = "Static/Mutable Descriptor Set";
#ifdef DILIGENT_DEVELOPMENT
        std::string _DescrSetName{m_Desc.Name};
        _DescrSetName.append(" - static/mutable set");
        DescrSetName = _DescrSetName.c_str();
#endif
        DescriptorSetAllocation SetAllocation = GetDevice()->AllocateDescriptorSet(~Uint64{0}, vkLayout, DescrSetName);
        ResourceCache.AssignDescriptorSetAllocation(GetDescriptorSetIndex<DESCRIPTOR_SET_ID_STATIC_MUTABLE>(), std::move(SetAllocation));
    }
}